

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString *
icu_63::TimeZoneFormat::truncateOffsetPattern
          (UnicodeString *offsetHM,UnicodeString *result,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UnicodeString local_150;
  UnicodeString local_110;
  int32_t local_cc;
  undefined1 local_c8 [4];
  int32_t idx_H;
  UnicodeString local_78;
  int32_t local_34;
  char16_t local_30 [2];
  int32_t idx_HH;
  UChar HH [2];
  int32_t idx_mm;
  UErrorCode *status_local;
  UnicodeString *result_local;
  UnicodeString *offsetHM_local;
  
  _HH = status;
  UnicodeString::setToBogus(result);
  UVar1 = ::U_FAILURE(*_HH);
  offsetHM_local = result;
  if (UVar1 == '\0') {
    idx_HH = UnicodeString::indexOf(offsetHM,L"mm",2,0);
    if (idx_HH < 0) {
      *_HH = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      local_30[0] = L'H';
      local_30[1] = L'H';
      UnicodeString::tempSubString(&local_78,offsetHM,0,idx_HH);
      iVar2 = UnicodeString::lastIndexOf(&local_78,local_30,2,0);
      UnicodeString::~UnicodeString(&local_78);
      local_34 = iVar2;
      if (iVar2 < 0) {
        UnicodeString::tempSubString(&local_110,offsetHM,0,idx_HH);
        iVar2 = UnicodeString::lastIndexOf(&local_110,L'H',0);
        UnicodeString::~UnicodeString(&local_110);
        if (iVar2 < 0) {
          *_HH = U_ILLEGAL_ARGUMENT_ERROR;
        }
        else {
          local_cc = iVar2;
          UnicodeString::tempSubString(&local_150,offsetHM,0,iVar2 + 1);
          offsetHM_local = UnicodeString::setTo(result,&local_150);
          UnicodeString::~UnicodeString(&local_150);
        }
      }
      else {
        UnicodeString::tempSubString((UnicodeString *)local_c8,offsetHM,0,iVar2 + 2);
        offsetHM_local = UnicodeString::setTo(result,(UnicodeString *)local_c8);
        UnicodeString::~UnicodeString((UnicodeString *)local_c8);
      }
    }
  }
  return offsetHM_local;
}

Assistant:

UnicodeString&
TimeZoneFormat::truncateOffsetPattern(const UnicodeString& offsetHM, UnicodeString& result, UErrorCode& status) {
    result.setToBogus();
    if (U_FAILURE(status)) {
        return result;
    }
    U_ASSERT(u_strlen(DEFAULT_GMT_OFFSET_MINUTE_PATTERN) == 2);

    int32_t idx_mm = offsetHM.indexOf(DEFAULT_GMT_OFFSET_MINUTE_PATTERN, 2, 0);
    if (idx_mm < 0) {
        // Bad time zone hour pattern data
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }
    UChar HH[] = {0x0048, 0x0048};
    int32_t idx_HH = offsetHM.tempSubString(0, idx_mm).lastIndexOf(HH, 2, 0);
    if (idx_HH >= 0) {
        return result.setTo(offsetHM.tempSubString(0, idx_HH + 2));
    }
    int32_t idx_H = offsetHM.tempSubString(0, idx_mm).lastIndexOf((UChar)0x0048, 0);
    if (idx_H >= 0) {
        return result.setTo(offsetHM.tempSubString(0, idx_H + 1));
    }
    // Bad time zone hour pattern data
    status = U_ILLEGAL_ARGUMENT_ERROR;
    return result;
}